

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void push_object(loc grid)

{
  object *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  feature *pfVar4;
  object *poVar5;
  queue *q;
  trap *ptVar6;
  object *dest;
  loc lVar7;
  object *poVar8;
  size_t sVar9;
  monster *pmVar10;
  wchar_t d;
  _Bool local_59;
  object *obj;
  queue *local_50;
  loc newgrid;
  
  pfVar4 = square_feat(cave,grid);
  poVar5 = square_object(cave,grid);
  obj = poVar5;
  q = q_new((ulong)z_info->floor_size);
  ptVar6 = square_trap(cave,grid);
  local_50 = q;
  while (poVar5 != (object *)0x0) {
    poVar1 = poVar5->next;
    dest = object_new();
    object_copy(dest,poVar5);
    dest->oidx = 0;
    lVar7 = (loc)loc(0,0);
    dest->grid = lVar7;
    if (dest->known != (object *)0x0) {
      poVar8 = object_new();
      dest->known = poVar8;
      object_copy(poVar8,poVar5->known);
      poVar8 = dest->known;
      poVar8->oidx = 0;
      lVar7 = (loc)loc(0,0);
      poVar8->grid = lVar7;
    }
    q = local_50;
    q_push(local_50,(uintptr_t)dest);
    delist_object(cave,poVar5);
    object_delete((chunk *)cave,(chunk *)player->cave,&obj);
    poVar5 = poVar1;
    obj = poVar1;
  }
  square_set_obj(cave,grid,(object *)0x0);
  square_force_floor(cave,grid);
  square_add_door(cave,grid,false);
LAB_001a1097:
  do {
    while( true ) {
      sVar9 = q_len(q);
      if (sVar9 == 0) {
        square_set_feat(cave,grid,pfVar4->fidx);
        if (ptVar6 != (trap *)0x0) {
          _Var2 = square_istrappable(cave,grid);
          if (!_Var2) {
            square_destroy_trap(cave,grid);
          }
        }
        q_free(q);
        return;
      }
      poVar5 = (object *)q_pop(q);
      obj = poVar5;
      if (poVar5->mimicking_m_idx != 0) break;
      drop_near((chunk *)cave,&obj,L'\0',grid,false,false);
    }
    pmVar10 = cave_monster(cave,(int)poVar5->mimicking_m_idx);
    if (pmVar10 == (monster *)0x0) {
      __assert_fail("mimic",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                    ,0x4c2,"void push_object(struct loc)");
    }
    pmVar10->mimicked_obj = (object *)0x0;
    d = L'\x01';
    while( true ) {
      if (d == L'\x04') break;
      wVar3 = scatter_ext(cave,&newgrid,L'\x01',grid,d,true,square_isempty);
      if (L'\0' < wVar3) {
        _Var2 = floor_carry((chunk *)cave,newgrid,poVar5,&local_59);
        if (_Var2) {
          monster_swap(grid,newgrid);
          pmVar10->mimicked_obj = poVar5;
          q = local_50;
          goto LAB_001a1097;
        }
      }
      d = d + L'\x01';
    }
    delete_monster_idx((chunk *)cave,(int)poVar5->mimicking_m_idx);
    if (poVar5->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&poVar5->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&obj);
    q = local_50;
  } while( true );
}

Assistant:

void push_object(struct loc grid)
{
	/* Save the original terrain feature */
	struct feature *feat_old = square_feat(cave, grid);
	struct object *obj = square_object(cave, grid);
	struct queue *queue = q_new(z_info->floor_size);
	struct trap *trap = square_trap(cave, grid);

	/* Push all objects on the square, stripped of pile info, into the queue */
	while (obj) {
		struct object *next = obj->next;
		/* In case the object is known, make a copy to work with
		 * and try to delete the original which will orphan it to
		 * serve as a placeholder for the known version. */
		struct object *newobj = object_new();

		object_copy(newobj, obj);
		newobj->oidx = 0;
		newobj->grid = loc(0, 0);
		if (newobj->known) {
			newobj->known = object_new();
			object_copy(newobj->known, obj->known);
			newobj->known->oidx = 0;
			newobj->known->grid = loc(0, 0);
		}
		q_push_ptr(queue, newobj);

		delist_object(cave, obj);
		object_delete(cave, player->cave, &obj);

		/* Next object */
		obj = next;
	}

	/* Disassociate the objects from the square */
	square_set_obj(cave, grid, NULL);

	/* Set feature to an open door */
	square_force_floor(cave, grid);
	square_add_door(cave, grid, false);

	/* Drop objects back onto the floor */
	while (q_len(queue) > 0) {
		/* Take object from the queue */
		obj = q_pop_ptr(queue);

		/* Unrevealed mimics require special handling, as always. */
		if (obj->mimicking_m_idx) {
			struct monster *mimic =
				cave_monster(cave, obj->mimicking_m_idx);
			int d;

			assert(mimic);
			/*
			 * Reset since the current value is a dangling
			 * reference to a deleted object.
			 */
			mimic->mimicked_obj = NULL;

			/* Try to find a location; use closer grids first. */
			d = 1;
			while (1) {
				struct loc newgrid;
				bool dummy = true;

				if (d >= 4) {
					/*
					 * Give up.  Destroy both the mimic
					 * and the object.
					 */
					delete_monster_idx(cave, obj->mimicking_m_idx);
					if (obj->known) {
						object_delete(player->cave, NULL, &obj->known);
					}
					object_delete(cave, player->cave, &obj);
					break;
				}
				if (scatter_ext(cave, &newgrid, 1, grid, d,
						true, square_isempty) > 0
						&& floor_carry(cave, newgrid,
						obj, &dummy)) {
					/*
					 * Move the monster and give it the
					 * object.
					 */
					monster_swap(grid, newgrid);
					mimic->mimicked_obj = obj;
					break;
				}
				++d;
			}
		} else {
			/* Drop the object */
			drop_near(cave, &obj, 0, grid, false, false);
		}
	}

	/* Reset cave feature, remove trap if needed */
	square_set_feat(cave, grid, feat_old->fidx);
	if (trap && !square_istrappable(cave, grid)) {
		square_destroy_trap(cave, grid);
	}

	q_free(queue);
}